

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O1

encoded_chars<char> tcb::unicode::detail::utf_traits<char,_1>::encode(code_point value)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar5 = (ulong)(uint)value;
  if ((uint)value < 0x80) {
    uVar1 = 0x100000000;
    uVar3 = 0;
    uVar4 = 0;
    uVar2 = 0;
  }
  else {
    if ((uint)value < 0x800) {
      uVar6 = (uint)value >> 6 | 0xc0;
      uVar3 = value & 0x3fU | 0x80;
      uVar1 = 0x200000000;
      uVar4 = 0;
      uVar2 = 0;
    }
    else if ((uint)value < 0x10000) {
      uVar6 = (uint)value >> 0xc | 0xe0;
      uVar3 = (uint)value >> 6 & 0x3f | 0x80;
      uVar4 = value & 0x3fU | 0x80;
      uVar1 = 0x300000000;
      uVar2 = 0;
    }
    else {
      uVar6 = (uint)value >> 0x12 | 0xf0;
      uVar3 = (uint)value >> 0xc & 0x3f | 0x80;
      uVar4 = (uint)value >> 6 & 0x3f | 0x80;
      uVar2 = (value & 0x3fU) << 8 | 0x8000;
      uVar1 = 0x400000000;
    }
    uVar5 = (ulong)uVar6;
  }
  return (encoded_chars<char>)(uVar5 & 0xff | uVar3 << 8 | uVar1 | (ulong)((uVar2 | uVar4) << 0x10))
  ;
}

Assistant:

encode(code_point value)
    {
        if (value <= 0x7F) {
            return {static_cast<char_type>(value)};
        }
        else if (value <= 0x7FF) {
            return {static_cast<char_type>((value >> 6) | 0xC0),
                    static_cast<char_type>((value & 0x3F) | 0x80)};
        }
        else if (TCB_LIKELY(value <= 0xFFFF)) {
            return {static_cast<char_type>((value >> 12) | 0xE0),
                    static_cast<char_type>(((value >> 6) & 0x3F) | 0x80),
                    static_cast<char_type>((value & 0x3F) | 0x80)};
        }
        else {
            return {static_cast<char_type>((value >> 18) | 0xF0),
                    static_cast<char_type>(((value >> 12) & 0x3F) | 0x80),
                    static_cast<char_type>(((value >> 6) & 0x3F) | 0x80),
                    static_cast<char_type>((value & 0x3F) | 0x80)};
        }
    }